

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

BuildValue * __thiscall
anon_unknown.dwarf_60e82::StaleFileRemovalCommand::getResultForOutput
          (BuildValue *__return_storage_ptr__,StaleFileRemovalCommand *this,Node *node,
          BuildValue *value)

{
  bool bVar1;
  ValueType local_40;
  BuildValue *local_28;
  BuildValue *value_local;
  Node *node_local;
  StaleFileRemovalCommand *this_local;
  
  local_28 = value;
  value_local = (BuildValue *)node;
  node_local = (Node *)this;
  this_local = (StaleFileRemovalCommand *)__return_storage_ptr__;
  bVar1 = llbuild::buildsystem::BuildValue::isFailedCommand(value);
  if (((!bVar1) &&
      (bVar1 = llbuild::buildsystem::BuildValue::isPropagatedFailureCommand(local_28), !bVar1)) &&
     (bVar1 = llbuild::buildsystem::BuildValue::isCancelledCommand(local_28), !bVar1)) {
    bVar1 = llbuild::buildsystem::BuildValue::isSkippedCommand(local_28);
    if (!bVar1) {
      llbuild::buildsystem::BuildValue::toData(&local_40,local_28);
      llbuild::buildsystem::BuildValue::fromData(__return_storage_ptr__,&local_40);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_40);
      return __return_storage_ptr__;
    }
    llbuild::buildsystem::BuildValue::makeSkippedCommand();
    return __return_storage_ptr__;
  }
  llbuild::buildsystem::BuildValue::makeFailedInput();
  return __return_storage_ptr__;
}

Assistant:

virtual BuildValue getResultForOutput(Node* node,
                                        const BuildValue& value) override {
    // If the value was a failed command, propagate the failure.
    if (value.isFailedCommand() || value.isPropagatedFailureCommand() ||
        value.isCancelledCommand())
      return BuildValue::makeFailedInput();
    if (value.isSkippedCommand())
      return BuildValue::makeSkippedCommand();

    // Otherwise, this was successful, return the value as-is.
    return BuildValue::fromData(value.toData());;
  }